

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

TypeBase * ApplyArraySizesToType(ExpressionContext *ctx,TypeBase *type,SynBase *sizes)

{
  bool bVar1;
  ExprBase *pEVar2;
  ExprIntegerLiteral *pEVar3;
  TypeClass *pTVar4;
  TypeClass *typeClass;
  ExprIntegerLiteral *number;
  ExprBase *sizeValue;
  SynBase *size;
  SynBase *sizes_local;
  TypeBase *type_local;
  ExpressionContext *ctx_local;
  
  bVar1 = isType<SynNothing>(sizes);
  sizeValue = (ExprBase *)sizes;
  if (bVar1) {
    sizeValue = (ExprBase *)0x0;
  }
  sizes_local = (SynBase *)type;
  if (sizes->next != (SynBase *)0x0) {
    sizes_local = (SynBase *)ApplyArraySizesToType(ctx,type,sizes->next);
  }
  bVar1 = isType<TypeAuto>((TypeBase *)sizes_local);
  if (bVar1) {
    if (sizeValue != (ExprBase *)0x0) {
      anon_unknown.dwarf_8df1c::Stop
                (ctx,(SynBase *)sizeValue,"ERROR: cannot specify array size for auto");
    }
    ctx_local = (ExpressionContext *)ctx->typeAutoArray;
  }
  else {
    if ((TypeBase *)sizes_local == ctx->typeVoid) {
      anon_unknown.dwarf_8df1c::Stop(ctx,sizes,"ERROR: cannot specify array size for void");
    }
    if (sizeValue == (ExprBase *)0x0) {
      if (0xffff < (long)sizes_local->next) {
        anon_unknown.dwarf_8df1c::Stop
                  (ctx,sizes,"ERROR: array element size cannot exceed 65535 bytes");
      }
      ctx_local = (ExpressionContext *)
                  ExpressionContext::GetUnsizedArrayType(ctx,(TypeBase *)sizes_local);
    }
    else {
      pEVar2 = AnalyzeExpression(ctx,(SynBase *)sizeValue);
      pEVar2 = CreateCast(ctx,(SynBase *)sizeValue,pEVar2,ctx->typeLong,false);
      pEVar2 = anon_unknown.dwarf_8df1c::EvaluateExpression(ctx,(SynBase *)sizeValue,pEVar2);
      pEVar3 = getType<ExprIntegerLiteral>(pEVar2);
      if (pEVar3 == (ExprIntegerLiteral *)0x0) {
        anon_unknown.dwarf_8df1c::Stop
                  (ctx,(SynBase *)sizeValue,"ERROR: array size cannot be evaluated");
        ctx_local = (ExpressionContext *)0x0;
      }
      else {
        if (pEVar3->value < 1) {
          anon_unknown.dwarf_8df1c::Stop
                    (ctx,(SynBase *)sizeValue,"ERROR: array size can\'t be negative or zero");
        }
        pTVar4 = getType<TypeClass>((TypeBase *)sizes_local);
        if (pTVar4 != (TypeClass *)0x0) {
          if ((pTVar4->completed & 1U) == 0) {
            anon_unknown.dwarf_8df1c::Stop
                      (ctx,(SynBase *)sizeValue,"ERROR: type \'%.*s\' is not fully defined",
                       (ulong)(uint)((int)sizes_local->end - (int)sizes_local->begin),
                       sizes_local->begin);
          }
          if ((pTVar4->hasFinalizer & 1U) != 0) {
            anon_unknown.dwarf_8df1c::Stop
                      (ctx,(SynBase *)sizeValue,
                       "ERROR: class \'%.*s\' implements \'finalize\' so only an unsized array type can be created"
                       ,(ulong)(uint)((int)sizes_local->end - (int)sizes_local->begin),
                       sizes_local->begin);
          }
        }
        if (0xffff < (long)sizes_local->next) {
          anon_unknown.dwarf_8df1c::Stop
                    (ctx,(SynBase *)sizeValue,"ERROR: array element size cannot exceed 65535 bytes")
          ;
        }
        bVar1 = AssertResolvableType(ctx,(SynBase *)sizeValue,(TypeBase *)sizes_local,true);
        if (bVar1) {
          ctx_local = (ExpressionContext *)
                      ExpressionContext::GetArrayType(ctx,(TypeBase *)sizes_local,pEVar3->value);
        }
        else {
          ctx_local = (ExpressionContext *)ExpressionContext::GetErrorType(ctx);
        }
      }
    }
  }
  return (TypeBase *)ctx_local;
}

Assistant:

TypeBase* ApplyArraySizesToType(ExpressionContext &ctx, TypeBase *type, SynBase *sizes)
{
	SynBase *size = sizes;

	if(isType<SynNothing>(size))
		size = NULL;

	if(sizes->next)
		type = ApplyArraySizesToType(ctx, type, sizes->next);

	if(isType<TypeAuto>(type))
	{
		if(size)
			Stop(ctx, size, "ERROR: cannot specify array size for auto");

		return ctx.typeAutoArray;
	}

	if(type == ctx.typeVoid)
		Stop(ctx, sizes, "ERROR: cannot specify array size for void");

	if(!size)
	{
		if(type->size >= 64 * 1024)
			Stop(ctx, sizes, "ERROR: array element size cannot exceed 65535 bytes");

		return ctx.GetUnsizedArrayType(type);
	}

	ExprBase *sizeValue = AnalyzeExpression(ctx, size);

	if(ExprIntegerLiteral *number = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, size, CreateCast(ctx, size, sizeValue, ctx.typeLong, false))))
	{
		if(number->value <= 0)
			Stop(ctx, size, "ERROR: array size can't be negative or zero");

		if(TypeClass *typeClass = getType<TypeClass>(type))
		{
			if(!typeClass->completed)
				Stop(ctx, size, "ERROR: type '%.*s' is not fully defined", FMT_ISTR(type->name));

			if(typeClass->hasFinalizer)
				Stop(ctx, size, "ERROR: class '%.*s' implements 'finalize' so only an unsized array type can be created", FMT_ISTR(type->name));
		}

		if(type->size >= 64 * 1024)
			Stop(ctx, size, "ERROR: array element size cannot exceed 65535 bytes");

		if(!AssertResolvableType(ctx, size, type, true))
			return ctx.GetErrorType();

		return ctx.GetArrayType(type, number->value);
	}

	Stop(ctx, size, "ERROR: array size cannot be evaluated");

	return NULL;
}